

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O0

rhash rhash_init(uint hash_id)

{
  int *piVar1;
  uint local_ac;
  uint local_a8;
  uint id;
  uint hash_ids [32];
  ulong local_20;
  size_t count;
  rhash prStack_10;
  uint hash_id_local;
  
  count._4_4_ = hash_id;
  if ((hash_id == 0) || ((hash_id & 0xfffffc00) != 0)) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    prStack_10 = (rhash)0x0;
  }
  else if ((hash_id & hash_id - 1) == 0) {
    prStack_10 = rhash_init_multi(1,(uint *)((long)&count + 4));
  }
  else {
    local_20 = 0;
    for (local_ac = hash_id & -hash_id; local_ac <= count._4_4_; local_ac = local_ac << 1) {
      if (local_ac == 0) {
        __assert_fail("id != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibrhash/librhash/rhash.c"
                      ,0xad,"rhash rhash_init(unsigned int)");
      }
      if ((count._4_4_ & local_ac) != 0) {
        (&local_a8)[local_20] = local_ac;
        local_20 = local_20 + 1;
      }
    }
    if (local_20 < 2) {
      __assert_fail("count > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibrhash/librhash/rhash.c"
                    ,0xb1,"rhash rhash_init(unsigned int)");
    }
    prStack_10 = rhash_init_multi(local_20,&local_a8);
  }
  return prStack_10;
}

Assistant:

RHASH_API rhash rhash_init(unsigned hash_id)
{
	if (!IS_VALID_HASH_MASK(hash_id)) {
		errno = EINVAL;
		return NULL;
	}
	if (HAS_ZERO_OR_ONE_BIT(hash_id)) {
		return rhash_init_multi(1, &hash_id);
	} else {
		/* handle the depricated case, when hash_id is a bitwise union of several hash function identifiers */
		size_t count;
		unsigned hash_ids[32];
		unsigned id = hash_id & -hash_id; /* get the trailing bit */
		for (count = 0; id <= hash_id; id = id << 1) {
			assert(id != 0);
			if (hash_id & id)
				hash_ids[count++] = id;
		}
		assert(count > 1);
		return rhash_init_multi(count, hash_ids);
	}
}